

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O3

iterator __thiscall
wabt::intrusive_list<wabt::Expr>::insert
          (intrusive_list<wabt::Expr> *this,iterator pos,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *node)

{
  size_t *psVar1;
  Expr *pEVar2;
  Expr *pEVar3;
  intrusive_list<wabt::Expr> *piVar4;
  Expr *pEVar5;
  iterator iVar6;
  
  pEVar5 = pos.node_;
  pEVar2 = (node->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
           super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
           super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
  if (((pEVar2->super_intrusive_list_base<wabt::Expr>).prev_ != (Expr *)0x0) ||
     ((pEVar2->super_intrusive_list_base<wabt::Expr>).next_ != (Expr *)0x0)) {
    __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                  ,0x205,
                  "typename intrusive_list<T>::iterator wabt::intrusive_list<wabt::Expr>::insert(iterator, std::unique_ptr<T>) [T = wabt::Expr]"
                 );
  }
  if (pos.list_ != this) {
    __assert_fail("list_ == rhs.list_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                  ,0xbc,
                  "bool wabt::intrusive_list<wabt::Expr>::iterator::operator==(iterator) const [T = wabt::Expr]"
                 );
  }
  (node->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
  super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  if (pEVar5 == (Expr *)0x0) {
    if (((pEVar2->super_intrusive_list_base<wabt::Expr>).prev_ != (Expr *)0x0) ||
       ((pEVar2->super_intrusive_list_base<wabt::Expr>).next_ != (Expr *)0x0)) {
      __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                    ,0x1bf,
                    "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
                   );
    }
    pEVar5 = this->last_;
    piVar4 = this;
    if (pEVar5 != (Expr *)0x0) {
      (pEVar2->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar5;
      piVar4 = (intrusive_list<wabt::Expr> *)&pEVar5->super_intrusive_list_base<wabt::Expr>;
    }
    piVar4->first_ = pEVar2;
    this->last_ = pEVar2;
    psVar1 = &this->size_;
    *psVar1 = *psVar1 + 1;
    if (*psVar1 == 0) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                    ,0x192,
                    "typename intrusive_list<T>::reference wabt::intrusive_list<wabt::Expr>::back() [T = wabt::Expr]"
                   );
    }
  }
  else {
    pEVar3 = (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_;
    (pEVar2->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar3;
    (pEVar2->super_intrusive_list_base<wabt::Expr>).next_ = pEVar5;
    piVar4 = (intrusive_list<wabt::Expr> *)&pEVar3->super_intrusive_list_base<wabt::Expr>;
    if (pEVar3 == (Expr *)0x0) {
      piVar4 = this;
    }
    piVar4->first_ = pEVar2;
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar2;
    this->size_ = this->size_ + 1;
  }
  iVar6.node_ = pEVar2;
  iVar6.list_ = this;
  return iVar6;
}

Assistant:

inline typename intrusive_list<T>::iterator intrusive_list<T>::insert(
    iterator pos,
    std::unique_ptr<T> node) {
  assert(node->prev_ == nullptr && node->next_ == nullptr);

  T* node_p;
  if (pos == end()) {
    push_back(std::move(node));
    node_p = &back();
  } else {
    node_p = node.release();
    node_p->prev_ = pos->prev_;
    node_p->next_ = &*pos;
    if (pos->prev_) {
      pos->prev_->next_ = node_p;
    } else {
      first_ = node_p;
    }
    pos->prev_ = node_p;
    size_++;
  }
  return iterator(*this, node_p);
}